

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parquet_reader.cpp
# Opt level: O2

void __thiscall duckdb::ParquetReader::~ParquetReader(ParquetReader *this)

{
  ~ParquetReader(this);
  operator_delete(this);
  return;
}

Assistant:

ParquetReader::~ParquetReader() {
}